

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.cpp
# Opt level: O0

DateTime * FIX::DateTime::nowLocal(void)

{
  DateTime *in_RDI;
  undefined1 local_20 [8];
  timeval tv;
  
  gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
  fromLocalTimeT(in_RDI,(time_t)local_20,(int)tv.tv_sec,6);
  return in_RDI;
}

Assistant:

DateTime DateTime::nowLocal() {
#if defined(_POSIX_SOURCE) || defined(HAVE_GETTIMEOFDAY)
  struct timeval tv;
  gettimeofday(&tv, 0);
  return fromLocalTimeT(tv.tv_sec, tv.tv_usec, 6);
#elif defined(HAVE_FTIME)
  timeb tb;
  ftime(&tb);
  return fromLocalTimeT(tb.time, tb.millitm);
#else
  return fromLocalTimeT(::time(0), 0);
#endif
}